

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.h
# Opt level: O0

void __thiscall
slang::ast::MinTypMaxExpression::visitExprs<slang::ast::DriverVisitor&>
          (MinTypMaxExpression *this,DriverVisitor *visitor)

{
  Expression *in_RSI;
  DriverVisitor *in_RDI;
  
  min((MinTypMaxExpression *)in_RDI);
  Expression::visit<slang::ast::DriverVisitor&>(in_RSI,in_RDI);
  typ((MinTypMaxExpression *)in_RDI);
  Expression::visit<slang::ast::DriverVisitor&>(in_RSI,in_RDI);
  max((MinTypMaxExpression *)in_RDI);
  Expression::visit<slang::ast::DriverVisitor&>(in_RSI,in_RDI);
  return;
}

Assistant:

decltype(auto) visitExprs(TVisitor&& visitor) const {
        min().visit(visitor);
        typ().visit(visitor);
        max().visit(visitor);
    }